

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O1

void __thiscall miniros::network::NetAddress::reset(NetAddress *this)

{
  if (this->rawAddress != (void *)0x0) {
    free(this->rawAddress);
    this->rawAddress = (void *)0x0;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->address,0,(char *)(this->address)._M_string_length,0x257bbb);
  this->port = 0;
  this->type = AddressInvalid;
  return;
}

Assistant:

void NetAddress::reset()
{
  if (rawAddress) {
    free(rawAddress);
    rawAddress = nullptr;
  }
  address = "";
  port = 0;
  type = Type::AddressInvalid;
}